

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rp.cpp
# Opt level: O1

uint64_t substitution_round<hf_queue<ll_el<unsigned_int,unsigned_int>,unsigned_int,unsigned_int>>
                   (hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *Q,
                   TP_t *TP,text_t *T)

{
  hash_t *this;
  int *piVar1;
  itype iVar2;
  long lVar3;
  pointer ppVar4;
  pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int> *this_00;
  bool bVar5;
  cpair cVar6;
  cpair cVar7;
  uint uVar8;
  ulong uVar9;
  itype iVar10;
  uint uVar11;
  pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int> *ppVar12;
  ulong uVar13;
  itype iVar14;
  cpair cVar15;
  cpair AB;
  cpair local_70;
  hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *local_68;
  TP_t *local_60;
  ulong local_58;
  pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int> *local_50;
  text_t *local_48;
  pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int> *local_40;
  uint64_t local_38;
  
  local_68 = Q;
  local_60 = TP;
  local_70 = hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::max(Q);
  if (G.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      G.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
    ::_M_realloc_insert<std::pair<unsigned_int,unsigned_int>const&>
              ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                *)&G,(iterator)
                     G.
                     super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_70);
  }
  else {
    ppVar4 = G.
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppVar4->first = local_70.first;
    ppVar4->second = local_70.second;
    G.
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         G.
         super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  lVar3 = *(long *)&(local_68->H).H.
                    super__Vector_base<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(ulong)local_70 & 0xffffffff].
                    super__Vector_base<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data;
  local_58 = *(ulong *)(lVar3 + ((ulong)local_70 >> 0x20) * 0xc);
  uVar8 = *(uint *)(lVar3 + 8 + ((ulong)local_70 >> 0x20) * 0xc);
  local_38 = (uint64_t)uVar8;
  n_distinct_freqs = n_distinct_freqs + (uVar8 != last_freq);
  uVar11 = (int)(local_58 >> 0x20) + (uint)local_58;
  local_50 = (pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int> *)(ulong)uVar11;
  last_freq = uVar8;
  local_40 = local_50;
  if ((uint)local_58 < uVar11) {
    this = &local_68->H;
    ppVar12 = (pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int> *)(local_58 & 0xffffffff)
    ;
    do {
      uVar8 = (local_60->TP).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start[(long)ppVar12];
      cVar6 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at(T,uVar8);
      if ((local_70.first == cVar6.first) && (local_70.second == cVar6.second)) {
        cVar6 = skippable_text<unsigned_int,_unsigned_int>::pair_ending_at(T,uVar8);
        cVar7 = skippable_text<unsigned_int,_unsigned_int>::next_pair(T,uVar8);
        skippable_text<unsigned_int,_unsigned_int>::replace(T,uVar8,X);
        bVar5 = pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int>::count(this,cVar6);
        if ((bVar5) && ((local_70.first != cVar6.first || (local_70.second != cVar6.second)))) {
          piVar1 = (int *)(*(long *)&(local_68->H).H.
                                     super__Vector_base<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start
                                     [(ulong)cVar6 & 0xffffffff].
                                     super__Vector_base<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>
                                     ._M_impl.super__Vector_impl_data + 8 +
                          ((ulong)cVar6 >> 0x20) * 0xc);
          *piVar1 = *piVar1 + -1;
        }
        bVar5 = pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int>::count(this,cVar7);
        if ((bVar5) && ((local_70.first != cVar7.first || (local_70.second != cVar7.second)))) {
          piVar1 = (int *)(*(long *)&(local_68->H).H.
                                     super__Vector_base<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start
                                     [(ulong)cVar7 & 0xffffffff].
                                     super__Vector_base<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>
                                     ._M_impl.super__Vector_impl_data + 8 +
                          ((ulong)cVar7 >> 0x20) * 0xc);
          *piVar1 = *piVar1 + -1;
        }
      }
      ppVar12 = (pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int> *)
                ((long)&(ppVar12->null).P_ab + 1);
    } while (local_40 != ppVar12);
  }
  if ((uint)local_58 < (uint)local_50) {
    local_50 = &local_68->H;
    ppVar12 = (pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int> *)(local_58 & 0xffffffff)
    ;
    local_48 = T;
    do {
      uVar8 = (local_60->TP).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start[(long)ppVar12];
      uVar11 = skippable_text<unsigned_int,_unsigned_int>::at(T,uVar8);
      if (uVar11 == X) {
        cVar6 = skippable_text<unsigned_int,_unsigned_int>::pair_ending_at(T,uVar8);
        cVar7 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at(T,uVar8);
        this_00 = local_50;
        uVar9 = (ulong)cVar7 >> 0x20;
        iVar14 = cVar6.first;
        iVar10 = iVar14;
        if (X == iVar14) {
          iVar10 = local_70.second;
        }
        uVar8 = cVar7.second;
        if (X == uVar8) {
          uVar9 = (ulong)local_70 & 0xffffffff;
        }
        iVar2 = T->BLANK;
        bVar5 = iVar2 == cVar6.second;
        if (bVar5 && iVar2 == iVar14) {
          iVar10 = iVar14;
        }
        local_58 = (ulong)local_70 & 0xffffffff;
        if (bVar5 && iVar2 == iVar14) {
          local_58 = (ulong)cVar6 >> 0x20;
        }
        bVar5 = iVar2 == cVar7.first;
        if (iVar2 == uVar8 && bVar5) {
          uVar9 = (ulong)uVar8;
        }
        uVar13 = (ulong)local_70.second;
        if (iVar2 == uVar8 && bVar5) {
          uVar13 = (ulong)cVar7 & 0xffffffff;
        }
        cVar15 = (cpair)(uVar13 + (uVar9 << 0x20));
        bVar5 = pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int>::count(local_50,cVar15);
        if ((bVar5) && (((uint)uVar13 != local_70.first || ((uint)uVar9 != local_70.second)))) {
          synchro_or_remove_pair<hf_queue<ll_el<unsigned_int,unsigned_int>,unsigned_int,unsigned_int>>
                    (local_68,local_60,local_48,cVar15);
        }
        uVar9 = local_58;
        cVar15 = (cpair)((ulong)iVar10 | local_58 << 0x20);
        bVar5 = pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int>::count(this_00,cVar15);
        T = local_48;
        if ((bVar5) && ((iVar10 != local_70.first || ((uint)uVar9 != local_70.second)))) {
          synchro_or_remove_pair<hf_queue<ll_el<unsigned_int,unsigned_int>,unsigned_int,unsigned_int>>
                    (local_68,local_60,local_48,cVar15);
        }
      }
      ppVar12 = (pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int> *)
                ((long)&(ppVar12->null).P_ab + 1);
    } while (local_40 != ppVar12);
  }
  synchronize<hf_queue<ll_el<unsigned_int,unsigned_int>,unsigned_int,unsigned_int>>
            (local_68,local_60,T,local_70);
  X = X + 1;
  return local_38;
}

Assistant:

uint64_t substitution_round(queue_t & Q, TP_t & TP, text_t & T){

	using ctype = text_t::char_type;

	//compute max
	cpair AB = Q.max();

	G.push_back(AB);

	//cout << "MAX freq = " << Q[AB].F_ab << endl;

	assert(Q.contains(AB));
	assert(Q[AB].F_ab >= Q.minimum_frequency());

	//extract P_AB and L_AB
	auto q_el = Q[AB];
	itype F_AB = q_el.F_ab;
	itype P_AB = q_el.P_ab;
	itype L_AB = q_el.L_ab;

	uint64_t f_replaced = F_AB;

	n_distinct_freqs += (F_AB != last_freq);
	last_freq = F_AB;

	for(itype j = P_AB; j<P_AB+L_AB;++j){

		itype i = TP[j];

		if(T.pair_starting_at(i) == AB){

			ctype A = AB.first;
			ctype B = AB.second;

			//the context of AB is xABy. We now extract AB's context:
			cpair xA = T.pair_ending_at(i);
			cpair By = T.next_pair(i);

			assert(xA == T.blank_pair() or xA.second == A);
			assert(By == T.blank_pair() or By.first == B);

			//note: xA and By could be blank pairs if this AB was the first/last pair in the text

			//perform replacement
			T.replace(i,X);

			assert(By == T.blank_pair() || T.pair_starting_at(i) == cpair(X,By.second));

			if(Q.contains(xA) && xA != AB){

				Q.decrease(xA);

			}

			if(Q.contains(By) && By != AB){

				Q.decrease(By);

			}

		}

	}

	/*
	 * re-scan text positions associated to AB and synchronize if needed
	 */
	for(itype j = P_AB; j<P_AB+L_AB;++j){

		itype i = TP[j];

		assert(T.pair_starting_at(i) != AB); //we replaced all ABs ...

		if(T[i] == X){

			//the context of X is xXy. We now extract X's left (x) and right (y) contexts:
			cpair xX = T.pair_ending_at(i);
			cpair Xy = T.pair_starting_at(i);

			ctype A = AB.first;
			ctype B = AB.second;

			//careful: x and y could be = X. in this case, before the replacements this xX was equal to ABAB -> a BA disappeared
			ctype x = xX.first == X ? B : xX.first;
			ctype y = Xy.second == X ? A : Xy.second;

			//these are the pairs that disappeared
			cpair xA = xX == T.blank_pair() ? xX : cpair {x,A};
			cpair By = Xy == T.blank_pair() ? Xy : cpair {B,y};

			if(Q.contains(By) && By != AB){

				synchro_or_remove_pair<queue_t>(Q, TP, T, By);

			}

			if(Q.contains(xA) && xA != AB){

				synchro_or_remove_pair<queue_t>(Q, TP, T, xA);

			}

		}

	}

	assert(Q.contains(AB));
	synchronize<queue_t>(Q, TP, T, AB); //automatically removes AB since new AB's frequency is 0
	assert(not Q.contains(AB));

	//advance next free dictionary symbol
	X++;

	//cout << " current text size = " << T.number_of_non_blank_characters() << endl << endl;

	return f_replaced;

}